

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageFieldGenerator::GenerateMergingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  char *text;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ == null) {\n  this.$name$ = new $type$();\n}\n");
  TVar1 = FieldDescriptor::type(this->descriptor_);
  text = "input.readMessage(this.$name$);\n";
  if (TVar1 == TYPE_GROUP) {
    text = "input.readGroup(this.$name$, $number$);\n";
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ == null) {\n"
    "  this.$name$ = new $type$();\n"
    "}\n");

  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
      "input.readGroup(this.$name$, $number$);\n");
  } else {
    printer->Print(variables_,
      "input.readMessage(this.$name$);\n");
  }
}